

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O3

void __thiscall
IR::GeneratorBailInInstr::GeneratorBailInInstr
          (GeneratorBailInInstr *this,JitArenaAllocator *allocator,Instr *yieldInstr)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  (this->super_LabelInstr).super_Instr.m_noLazyHelperAssert = false;
  (this->super_LabelInstr).super_Instr.m_next = (Instr *)0x0;
  (this->super_LabelInstr).super_Instr.m_prev = (Instr *)0x0;
  (this->super_LabelInstr).super_Instr.m_func = (Func *)0x0;
  (this->super_LabelInstr).super_Instr.globOptInstrString = (char16 *)0x0;
  (this->super_LabelInstr).super_Instr.m_opcode = MaxByteSizedOpcodes;
  (this->super_LabelInstr).super_Instr.ignoreOverflowBitCount = ' ';
  (this->super_LabelInstr).super_Instr.highlight = 0;
  puVar1 = &(this->super_LabelInstr).super_Instr.field_0x36;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 1;
  puVar1 = &(this->super_LabelInstr).super_Instr.field_0x38;
  *puVar1 = *puVar1 & 0x80;
  (this->super_LabelInstr).super_Instr.m_number = 0xffffffff;
  (this->super_LabelInstr).super_Instr.m_dst = (Opnd *)0x0;
  (this->super_LabelInstr).super_Instr.m_src1 = (Opnd *)0x0;
  (this->super_LabelInstr).super_Instr.m_src2 = (Opnd *)0x0;
  (this->super_LabelInstr).labelRefs.
  super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&(this->super_LabelInstr).labelRefs;
  (this->super_LabelInstr).labelRefs.
  super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount.count = 0;
  (this->super_LabelInstr).labelRefs.
  super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.allocator =
       &allocator->super_ArenaAllocator;
  puVar1 = &(this->super_LabelInstr).field_0x78;
  *puVar1 = *puVar1 & 0xc0;
  (this->super_LabelInstr).m_region = (Region *)0x0;
  *(undefined4 *)((long)&(this->super_LabelInstr).m_block + 4) = 0;
  *(undefined8 *)((long)&(this->super_LabelInstr).m_name + 4) = 0;
  *(undefined8 *)((long)&(this->super_LabelInstr).m_pc + 4) = 0;
  *(undefined8 *)&(this->super_LabelInstr).m_id = 0;
  *(undefined8 *)((long)&(this->super_LabelInstr).m_loweredBasicBlock + 4) = 0;
  (this->super_LabelInstr).super_Instr._vptr_Instr = (_func_int **)&PTR_Dump_014d5798;
  this->yieldInstr = yieldInstr;
  (this->capturedValues).constantValues.super_SListNodeBase<Memory::ArenaAllocator>.next =
       (Type)&this->capturedValues;
  (this->capturedValues).constantValues.super_RealCount.count = 0;
  (this->capturedValues).copyPropSyms.super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->capturedValues).copyPropSyms.super_SListNodeBase<Memory::ArenaAllocator>;
  (this->capturedValues).copyPropSyms.super_RealCount.count = 0;
  (this->capturedValues).argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  (this->capturedValues).refCount = 0;
  (this->upwardExposedUses).head = (Type_conflict)0x0;
  (this->upwardExposedUses).lastFoundIndex = (Type_conflict)0x0;
  (this->upwardExposedUses).alloc = allocator;
  (this->upwardExposedUses).lastUsedNodePrevNextField = &(this->upwardExposedUses).head;
  if ((yieldInstr == (Instr *)0x0) || (yieldInstr->m_opcode != Yield)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x465,"(yieldInstr != nullptr && yieldInstr->m_opcode == Js::OpCode::Yield)"
                       ,"yieldInstr != nullptr && yieldInstr->m_opcode == Js::OpCode::Yield");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

GeneratorBailInInstr(JitArenaAllocator* allocator, IR::Instr* yieldInstr) :
        LabelInstr(allocator),
        yieldInstr(yieldInstr),
        upwardExposedUses(allocator)
    {
        Assert(yieldInstr != nullptr && yieldInstr->m_opcode == Js::OpCode::Yield);
    }